

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_round_to_flat_curves(Ref<embree::SceneGraph::Node> *node)

{
  long *plVar1;
  Node *pNVar2;
  bool bVar3;
  Ref<embree::SceneGraph::Node> *pRVar4;
  long *plVar5;
  size_type sVar6;
  reference pvVar7;
  long *in_RSI;
  Node *in_RDI;
  Ref<embree::SceneGraph::HairSetNode> hmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  _func_int **local_410;
  long *local_3a0;
  long *local_340;
  Ref<embree::SceneGraph::Node> *local_2e0;
  Node *local_2a0;
  ulong local_298;
  long local_280;
  Node *local_268;
  
  if (*in_RSI == 0) {
    local_2e0 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_2e0 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_2e0 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_2e0->ptr->fileName)();
  }
  if (local_2e0 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RSI == 0) {
      local_340 = (long *)0x0;
    }
    else {
      local_340 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_340 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_3a0 = (long *)0x0;
      }
      else {
        local_3a0 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_3a0 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_410 = (_func_int **)0x0;
        }
        else {
          local_410 = (_func_int **)__dynamic_cast(*in_RSI,&Node::typeinfo,&HairSetNode::typeinfo,0)
          ;
        }
        if (local_410 == (_func_int **)0x0) {
          bVar3 = false;
        }
        else {
          (**(code **)(*local_410 + 0x10))();
          if (*(int *)(local_410 + 0xe) == 0x10) {
            *(undefined4 *)(local_410 + 0xe) = 0x11;
          }
          else if (*(int *)(local_410 + 0xe) == 0x18) {
            *(undefined4 *)(local_410 + 0xe) = 0x19;
          }
          else if (*(int *)(local_410 + 0xe) == 0x20) {
            *(undefined4 *)(local_410 + 0xe) = 0x21;
          }
          (in_RDI->super_RefCount)._vptr_RefCount = local_410;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          bVar3 = true;
        }
        if (local_410 != (_func_int **)0x0) {
          (**(code **)(*local_410 + 0x18))();
        }
        if (!bVar3) goto LAB_002008cb;
      }
      else {
        (**(code **)(*local_3a0 + 0x10))();
        for (local_298 = 0;
            sVar6 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_3a0 + 0xd)), local_298 < sVar6; local_298 = local_298 + 1) {
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_3a0 + 0xd),local_298);
          pNVar2 = pvVar7->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          convert_round_to_flat_curves(local_2e0);
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_3a0 + 0xd),local_298);
          if (pvVar7->ptr != (Node *)0x0) {
            (*(pvVar7->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar7->ptr = local_2a0;
          local_2a0 = (Node *)0x0;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_002008cb:
        bVar3 = false;
      }
      if (local_3a0 != (long *)0x0) {
        (**(code **)(*local_3a0 + 0x18))();
      }
      if (!bVar3) goto LAB_00200967;
    }
    else {
      (**(code **)(*local_340 + 0x10))();
      plVar1 = (long *)local_340[0x10];
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))();
      }
      convert_round_to_flat_curves(local_2e0);
      plVar5 = local_340 + 0x10;
      if (*plVar5 != 0) {
        (**(code **)(*(long *)*plVar5 + 0x18))();
      }
      *plVar5 = local_280;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
LAB_00200967:
      bVar3 = false;
    }
    if (local_340 != (long *)0x0) {
      (**(code **)(*local_340 + 0x18))();
    }
    if (bVar3) goto LAB_00200a11;
  }
  else {
    pNVar2 = local_2e0[0x13].ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
    }
    convert_round_to_flat_curves(local_2e0);
    pRVar4 = local_2e0 + 0x13;
    if (pRVar4->ptr != (Node *)0x0) {
      (*(pRVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar4->ptr = local_268;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar3 = false;
LAB_00200a11:
  if (local_2e0 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_2e0->ptr->fileName)._M_string_length)();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_round_to_flat_curves(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_round_to_flat_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_round_to_flat_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_round_to_flat_curves(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;

      return hmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }